

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtCofactor1p(word *pOut,word *pIn,int nWords,int iVar)

{
  int iVar1;
  int local_34;
  int iStep;
  int i;
  word *pLimit;
  int shift;
  int w;
  int iVar_local;
  int nWords_local;
  word *pIn_local;
  word *pOut_local;
  
  if (nWords == 1) {
    *pOut = *pIn & s_Truths6[iVar] |
            (*pIn & s_Truths6[iVar]) >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f);
  }
  else if (iVar < 6) {
    for (pLimit._4_4_ = 0; pLimit._4_4_ < nWords; pLimit._4_4_ = pLimit._4_4_ + 1) {
      pOut[pLimit._4_4_] =
           pIn[pLimit._4_4_] & s_Truths6[iVar] |
           (pIn[pLimit._4_4_] & s_Truths6[iVar]) >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f);
    }
  }
  else {
    iVar1 = Abc_TtWordNum(iVar);
    pIn_local = pOut;
    for (_iVar_local = pIn; _iVar_local < pIn + nWords; _iVar_local = _iVar_local + (iVar1 << 1)) {
      for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
        pIn_local[local_34] = _iVar_local[local_34 + iVar1];
        pIn_local[local_34 + iVar1] = _iVar_local[local_34 + iVar1];
      }
      pIn_local = pIn_local + (iVar1 << 1);
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCofactor1p( word * pOut, word * pIn, int nWords, int iVar )
{
    if ( nWords == 1 )
        pOut[0] = (pIn[0] & s_Truths6[iVar]) | ((pIn[0] & s_Truths6[iVar]) >> (1 << iVar));
	else if ( iVar <= 5 )
	{
		int w, shift = (1 << iVar);
		for ( w = 0; w < nWords; w++ )
            pOut[w] = (pIn[w] & s_Truths6[iVar]) | ((pIn[w] & s_Truths6[iVar]) >> shift);
	}
	else // if ( iVar > 5 )
	{
        word * pLimit = pIn + nWords;
		int i, iStep = Abc_TtWordNum(iVar);
		for ( ; pIn < pLimit; pIn += 2*iStep, pOut += 2*iStep )
			for ( i = 0; i < iStep; i++ )
            {
                pOut[i]         = pIn[i + iStep];
                pOut[i + iStep] = pIn[i + iStep];
            }
	}	
}